

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

PAL_ERROR FILEGetLastErrorFromErrnoAndFilename(LPSTR lpPath)

{
  undefined8 in_RAX;
  int *piVar1;
  DWORD local_14 [2];
  PAL_ERROR palError;
  
  local_14[0] = (DWORD)((ulong)in_RAX >> 0x20);
  piVar1 = __errno_location();
  if (*piVar1 == 2) {
    FILEGetProperNotFoundError(lpPath,local_14);
  }
  else {
    local_14[0] = FILEGetLastErrorFromErrno();
  }
  return local_14[0];
}

Assistant:

PAL_ERROR FILEGetLastErrorFromErrnoAndFilename(LPSTR lpPath)
{
    PAL_ERROR palError;
    if (ENOENT == errno)
    {
        FILEGetProperNotFoundError(lpPath, &palError);
    }
    else
    {
        palError = FILEGetLastErrorFromErrno();
    }
    return palError;
}